

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O2

void cycle_value_do_proc(Am_Object *command_obj)

{
  unsigned_short uVar1;
  int value;
  Am_Value *pAVar2;
  int value_00;
  Am_Value_List labels;
  Am_Value_List local_30;
  
  pAVar2 = Am_Object::Get(command_obj,0x1aa,0);
  Am_Value_List::Am_Value_List(&local_30,pAVar2);
  uVar1 = Am_Value_List::Length(&local_30);
  pAVar2 = Am_Object::Get(command_obj,0x1d4,0);
  value = Am_Value::operator_cast_to_int(pAVar2);
  Am_Object::Set(command_obj,0x16c,value,0);
  value_00 = value + 1;
  if ((int)(uint)uVar1 <= value + 1) {
    value_00 = 0;
  }
  if (uVar1 == 0) {
    value_00 = 0;
  }
  Am_Object::Set(command_obj,0x169,value_00,0);
  Am_Value_List::~Am_Value_List(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, cycle_value_do,
                 (Am_Object command_obj))
{
  Am_Value_List labels = command_obj.Get(Am_LABEL_LIST);
  int len = labels.Length();
  int cur_val = command_obj.Get(Am_COMPUTE_INTER_VALUE);
  command_obj.Set(Am_OLD_VALUE, cur_val);
  if (len == 0) {
    command_obj.Set(Am_VALUE, 0); //Am_COMPUTE_INTER_VALUE will be set
                                  //by formula
  } else {
    cur_val++;
    if (cur_val >= len)
      cur_val = 0;
    command_obj.Set(Am_VALUE, cur_val); //Am_COMPUTE_INTER_VALUE will be set by
                                        //cycle_value_get_string formula
  }
}